

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# widgets.cpp
# Opt level: O1

void __thiscall
dlib::list_box_helper::
list_box<std::__cxx11::basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_>
::reset(list_box<std::__cxx11::basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_>
        *this)

{
  auto_mutex M;
  auto_mutex local_30;
  
  local_30.r = (this->super_scrollable_region).super_drawable.m;
  local_30.m = (mutex *)0x0;
  local_30.rw = (read_write_mutex *)0x0;
  rmutex::lock(local_30.r,1);
  (this->items)._at_start = true;
  (this->items).pos =
       (data<std::__cxx11::basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_>
        *)0x0;
  auto_mutex::unlock(&local_30);
  return;
}

Assistant:

void list_box<S>::
    reset (
    ) const
    {
        auto_mutex M(m);
        items.reset();
    }